

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O0

bool parseArgs(int argn,char **argv,Parameters *params)

{
  char *pcVar1;
  bool bVar2;
  long in_RSI;
  int in_EDI;
  string arg5;
  string arg4;
  string arg3_2;
  string arg3_1;
  string arg3;
  bool affinity;
  int seed;
  uint p;
  uint n;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  allocator *in_stack_fffffffffffffe98;
  tuple<unsigned_int,_unsigned_int,_int,_bool> *in_stack_fffffffffffffea0;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  uint local_60;
  allocator local_49;
  string local_48 [35];
  undefined1 local_25;
  int local_24;
  uint local_20;
  uint local_1c;
  long local_10;
  int local_8;
  byte local_1;
  
  if ((in_EDI < 3) || (6 < in_EDI)) {
    local_1 = 0;
    goto LAB_00104d01;
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_1c = atoi(*(char **)(in_RSI + 8));
  local_20 = atoi(*(char **)(local_10 + 0x10));
  local_24 = -1;
  local_25 = 0;
  if (local_8 == 4) {
    pcVar1 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    bVar2 = std::operator==(in_stack_fffffffffffffe90,
                            (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                             CONCAT16(in_stack_fffffffffffffe8e,
                                                      CONCAT15(in_stack_fffffffffffffe8d,
                                                               CONCAT14(in_stack_fffffffffffffe8c,
                                                                        in_stack_fffffffffffffe88)))
                                            ));
    if (bVar2) {
      local_25 = 1;
    }
    else {
      local_1 = 0;
    }
    local_60 = (uint)!bVar2;
    std::__cxx11::string::~string(local_48);
joined_r0x00104c23:
    if (local_60 != 0) goto LAB_00104d01;
  }
  else {
    if (local_8 == 5) {
      pcVar1 = *(char **)(local_10 + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar1,&local_81);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      bVar2 = std::operator==(in_stack_fffffffffffffe90,
                              (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                               CONCAT16(in_stack_fffffffffffffe8e,
                                                        CONCAT15(in_stack_fffffffffffffe8d,
                                                                 CONCAT14(in_stack_fffffffffffffe8c,
                                                                          in_stack_fffffffffffffe88)
                                                                ))));
      if (bVar2) {
        local_24 = atoi(*(char **)(local_10 + 0x20));
      }
      else {
        local_1 = 0;
      }
      local_60 = (uint)!bVar2;
      std::__cxx11::string::~string(local_80);
      goto joined_r0x00104c23;
    }
    if (local_8 == 6) {
      pcVar1 = *(char **)(local_10 + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      in_stack_fffffffffffffea0 =
           *(tuple<unsigned_int,_unsigned_int,_int,_bool> **)(local_10 + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,(char *)in_stack_fffffffffffffea0,&local_d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      in_stack_fffffffffffffe90 =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 0x28);
      in_stack_fffffffffffffe98 = &local_f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f8,(char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      in_stack_fffffffffffffe8f =
           std::operator==(in_stack_fffffffffffffe90,
                           (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                            CONCAT16(in_stack_fffffffffffffe8e,
                                                     CONCAT15(in_stack_fffffffffffffe8d,
                                                              CONCAT14(in_stack_fffffffffffffe8c,
                                                                       in_stack_fffffffffffffe88))))
                          );
      if (((bool)in_stack_fffffffffffffe8f) &&
         (in_stack_fffffffffffffe8e =
               std::operator==(in_stack_fffffffffffffe90,
                               (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                                CONCAT16(in_stack_fffffffffffffe8e,
                                                         CONCAT15(in_stack_fffffffffffffe8d,
                                                                  CONCAT14(in_stack_fffffffffffffe8c
                                                                           ,
                                                  in_stack_fffffffffffffe88))))),
         (bool)in_stack_fffffffffffffe8e)) {
        local_24 = atoi(*(char **)(local_10 + 0x20));
LAB_00104be8:
        local_25 = 1;
        local_60 = 0;
      }
      else {
        in_stack_fffffffffffffe8d =
             std::operator==(in_stack_fffffffffffffe90,
                             (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                              CONCAT16(in_stack_fffffffffffffe8e,
                                                       CONCAT15(in_stack_fffffffffffffe8d,
                                                                CONCAT14(in_stack_fffffffffffffe8c,
                                                                         in_stack_fffffffffffffe88))
                                                      )));
        if (((bool)in_stack_fffffffffffffe8d) &&
           (in_stack_fffffffffffffe8c =
                 std::operator==(in_stack_fffffffffffffe90,
                                 (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                                  CONCAT16(in_stack_fffffffffffffe8e,
                                                           CONCAT15(in_stack_fffffffffffffe8d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe8c,
                                                  in_stack_fffffffffffffe88))))),
           (bool)in_stack_fffffffffffffe8c)) {
          local_24 = atoi(*(char **)(local_10 + 0x28));
          goto LAB_00104be8;
        }
        local_1 = 0;
        local_60 = 1;
      }
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_a8);
      goto joined_r0x00104c23;
    }
  }
  if (local_1c % local_20 == 0) {
    std::tuple<unsigned_int,_unsigned_int,_int,_bool>::
    tuple<unsigned_int_&,_unsigned_int_&,_int_&,_bool_&,_true,_true>
              (in_stack_fffffffffffffea0,(uint *)in_stack_fffffffffffffe98,
               (uint *)in_stack_fffffffffffffe90,
               (int *)CONCAT17(in_stack_fffffffffffffe8f,
                               CONCAT16(in_stack_fffffffffffffe8e,
                                        CONCAT15(in_stack_fffffffffffffe8d,
                                                 CONCAT14(in_stack_fffffffffffffe8c,
                                                          in_stack_fffffffffffffe88)))),
               (bool *)0x104ce7);
    std::tuple<unsigned_int,_unsigned_int,_int,_bool>::operator=
              ((tuple<unsigned_int,_unsigned_int,_int,_bool> *)in_stack_fffffffffffffe90,
               (type)CONCAT17(in_stack_fffffffffffffe8f,
                              CONCAT16(in_stack_fffffffffffffe8e,
                                       CONCAT15(in_stack_fffffffffffffe8d,
                                                CONCAT14(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88)))));
    local_1 = 1;
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "The length of vector must be multiple of number of processors!\n");
    local_1 = 0;
  }
LAB_00104d01:
  return (bool)(local_1 & 1);
}

Assistant:

bool parseArgs (int argn, char **argv, Parameters &params) {
	if (argn < 3 || argn > 6) {
		return false;
	}

	try {
		uint n			= std::atoi (argv[1]);
		uint p			= std::atoi (argv[2]);
		int seed		= -1;
		bool affinity	= false;

		
		if (argn == 4) {
			std::string arg3	= argv[3];
			if (arg3 == "-a")
				affinity	= true;
			else
				return false;
		}
		else if (argn == 5) {
			std::string arg3	= argv[3];
			if (arg3 == "-s")
				seed	= std::atoi (argv[4]);
			else
				return false;
		}
		else if (argn == 6) {
			std::string arg3	= argv[3];
			std::string arg4	= argv[4];
			std::string arg5	= argv[5];

			if (arg3 == "-s" && arg5 == "-a") {
				seed		= std::atoi (argv[4]);
				affinity	= true;
			}
			else if (arg3 == "-a" && arg4 == "-s") {
				seed		= std::atoi (argv[5]);
				affinity	= true;
			}
			else
				return false;
		}

		if (n%p != 0) {
			std::cerr << "The length of vector must be multiple of number of processors!\n";
			return false;
		}

		params	= Parameters (n, p, seed, affinity);

		return true;
	} catch (...) {
		return false;
	}
}